

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O0

vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
* cutout(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
         *__return_storage_ptr__,tile_t *tile,rotation_e rotation)

{
  value_type vVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  reference pvVar4;
  reference pvVar5;
  int local_d0;
  int local_cc;
  int j;
  int i_1;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  rotated;
  size_t rot;
  rotation_e local_9c;
  undefined1 local_98 [4];
  int steps;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  size_t i;
  allocator_type local_4a;
  value_type local_49;
  vector<char,_std::allocator<char>_> local_48;
  undefined1 local_29;
  ulong local_28;
  size_t len;
  tile_t *ptStack_18;
  rotation_e rotation_local;
  tile_t *tile_local;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *cutout;
  
  local_28 = 8;
  local_29 = 0;
  local_49 = 'x';
  len._4_4_ = rotation;
  ptStack_18 = tile;
  tile_local = (tile_t *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_48,8,&local_49,&local_4a);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)((long)&i + 3));
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,8,&local_48,
           (allocator<std::vector<char,_std::allocator<char>_>_> *)((long)&i + 3));
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)((long)&i + 3));
  std::vector<char,_std::allocator<char>_>::~vector(&local_48);
  std::allocator<char>::~allocator(&local_4a);
  local_68 = 0;
  pvVar2 = std::array<std::array<char,_10UL>,_10UL>::cbegin(&ptStack_18->data);
  pvVar3 = std::array<std::array<char,_10UL>,_10UL>::cend(&ptStack_18->data);
  local_70 = &local_68;
  local_78 = __return_storage_ptr__;
  std::ranges::__for_each_fn::
  operator()<const_std::array<char,_10UL>_*,_const_std::array<char,_10UL>_*,_std::identity,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day20_jurassic_jigsaw_cpp:261:66)>
            (local_98,(__for_each_fn *)&std::ranges::for_each,pvVar2 + 1,pvVar3 + -1,
             __return_storage_ptr__,local_70);
  local_9c = len._4_4_;
  if (3 < (int)len._4_4_) {
    local_9c = len._4_4_ - FlipRot0;
    std::ranges::__for_each_fn::
    operator()<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day20_jurassic_jigsaw_cpp:268:30)>
              ((__for_each_fn *)&std::ranges::for_each,__return_storage_ptr__);
  }
  for (rotated.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rotated.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)(long)(int)local_9c;
      rotated.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&((rotated.
                       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x1) {
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)&j,__return_storage_ptr__);
    for (local_cc = 0; (ulong)(long)local_cc < local_28; local_cc = local_cc + 1) {
      for (local_d0 = 0; (ulong)(long)local_d0 < local_28; local_d0 = local_d0 + 1) {
        pvVar4 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)local_d0);
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           (pvVar4,(local_28 - (long)local_cc) - 1);
        vVar1 = *pvVar5;
        pvVar4 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                               *)&j,(long)local_cc);
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](pvVar4,(long)local_d0);
        *pvVar5 = vVar1;
      }
    }
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator=(__return_storage_ptr__,
                (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *)&j);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)&j);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<char>> cutout(const tile_t& tile, tile_t::rotation_e rotation) {
  auto len = tile_t::N-2;
  std::vector<std::vector<char>> cutout (len, std::vector<char>(len, 'x'));

  size_t i = 0;
  ranges::for_each(tile.data.cbegin() + 1, tile.data.cend() - 1, [&](const auto& row){
    ranges::copy(row.cbegin() + 1, row.cend() - 1, cutout.at(i++).begin());
  });

  auto steps = static_cast<int>(rotation);
  if (steps >= 4) {
    steps -= 4;
    ranges::for_each(cutout, [](auto& row){
      ranges::reverse(row);
    });
  }
  for (size_t rot = 0; rot < steps; rot++) {
    auto rotated = cutout;
    for (int i = 0; i < len; ++i) {
      for (int j = 0; j < len; ++j) {
        rotated[i][j] = cutout[j][len - i - 1];
      }
    }
    cutout = rotated;
  }

  return cutout;
}